

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerMSL::emit_subgroup_op(CompilerMSL *this,Instruction *i)

{
  ushort uVar1;
  uint32_t uVar2;
  BaseType BVar3;
  Platform PVar4;
  uint32_t uVar5;
  uint uVar6;
  uint32_t uVar7;
  uint32_t *puVar8;
  CompilerError *this_00;
  uint32_t op1;
  BaseType input_type;
  char *pcVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  bool bVar13;
  string local_50;
  
  puVar8 = Compiler::stream((Compiler *)this,i);
  uVar1 = i->op;
  if ((this->msl_options).emulate_subgroups == true) {
    if (uVar1 == 0x14d) {
      uVar5 = *puVar8;
      uVar2 = puVar8[1];
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"true","");
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar5,uVar2,&local_50,true,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) {
        return;
      }
      operator_delete(local_50._M_dataplus._M_p);
      return;
    }
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (this_00,"Subgroup emulation does not support operations other than Elect.");
    goto LAB_00261ff6;
  }
  if ((this->msl_options).msl_version < 20000) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Subgroups are only supported in Metal 2.0 and up.");
    goto LAB_00261ff6;
  }
  uVar5 = CompilerGLSL::get_integer_width_for_instruction(&this->super_CompilerGLSL,i);
  uVar10 = uVar5 - 8 >> 3;
  uVar6 = uVar5 << 0x1d | uVar10;
  if ((7 < uVar6) || ((0x8bU >> (uVar10 & 0x1f) & 1) == 0)) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Invalid bit width.");
    goto LAB_00261ff6;
  }
  if ((0x8bU >> (uVar10 & 0x1f) & 1) == 0) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Invalid bit width.");
    goto LAB_00261ff6;
  }
  input_type = *(BaseType *)(&DAT_003944e0 + (ulong)uVar6 * 4);
  BVar3 = *(BaseType *)(&DAT_00394500 + (ulong)uVar6 * 4);
  PVar4 = (this->msl_options).platform;
  if (PVar4 == macOS) {
    if (((((this->msl_options).msl_version < 0x4e84) && (3 < uVar1 - 0x159)) && (uVar1 != 0x151)) &&
       (uVar1 != 0x1150)) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,
                 "Subgroup ops beyond broadcast and shuffle on macOS require Metal 2.1 and up.");
      goto LAB_00261ff6;
    }
  }
  else if (PVar4 == iOS) {
    uVar10 = (this->msl_options).msl_version;
    if ((uVar10 < 0x4f4c) || ((this->msl_options).ios_use_simdgroup_functions == false)) {
      if (uVar1 < 0x1145) {
        switch(uVar1) {
        case 0x14d:
          if (uVar10 < 0x4ee8) {
            this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(this_00,"Elect on iOS requires Metal 2.2 and up.");
            goto LAB_00261ff6;
          }
          break;
        case 0x14e:
        case 0x14f:
        case 0x150:
        case 0x153:
        case 0x154:
        case 0x155:
        case 0x156:
        case 0x157:
        case 0x158:
switchD_0026145a_caseD_14e:
          if (uVar10 < 0x4ee8) {
            this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(this_00,"Ballot ops on iOS requires Metal 2.2 and up.");
            goto LAB_00261ff6;
          }
          break;
        case 0x151:
        case 0x159:
        case 0x15a:
        case 0x15b:
        case 0x15c:
        case 0x16d:
        case 0x16e:
          break;
        case 0x152:
          if (uVar10 < 0x4ee8) {
            this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(this_00,"BroadcastFirst on iOS requires Metal 2.2 and up.")
            ;
            goto LAB_00261ff6;
          }
          break;
        default:
switchD_0026145a_caseD_15d:
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (this_00,
                     "Subgroup ops beyond broadcast, ballot, and shuffle on iOS require Metal 2.3 and up."
                    );
          goto LAB_00261ff6;
        }
      }
      else {
        if ((uVar1 - 0x114c < 3) || (uVar1 == 0x1145)) goto switchD_0026145a_caseD_14e;
        if (uVar1 != 0x1150) goto switchD_0026145a_caseD_15d;
      }
    }
  }
  uVar5 = *puVar8;
  uVar2 = puVar8[1];
  uVar10 = uVar1 - 0x1145;
  if ((uVar10 < 0xc) && ((0xb83U >> (uVar10 & 0x1f) & 1) != 0)) {
    lVar12 = 2;
    bVar13 = true;
  }
  else {
    uVar7 = Compiler::evaluate_constant_u32((Compiler *)this,puVar8[2]);
    bVar13 = uVar7 == 3;
    lVar12 = 3;
  }
  if (!bVar13) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Only subgroup scope is supported.");
    goto LAB_00261ff6;
  }
  iVar11 = (int)lVar12;
  switch(uVar1) {
  case 0x14d:
    if (((this->msl_options).platform == iOS) &&
       (((this->msl_options).ios_use_simdgroup_functions & 1U) == 0)) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"quad_is_first()","");
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar5,uVar2,&local_50,false,false);
    }
    else {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"simd_is_first()","");
      CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar5,uVar2,&local_50,false,false);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    goto LAB_00261f49;
  case 0x14e:
    goto switchD_00261551_caseD_14e;
  case 0x14f:
switchD_00261551_caseD_14f:
    uVar7 = puVar8[lVar12];
    if (((this->msl_options).platform == iOS) &&
       (((this->msl_options).ios_use_simdgroup_functions & 1U) == 0)) {
      pcVar9 = "quad_any";
    }
    else {
      pcVar9 = "simd_any";
    }
    goto LAB_00261f3e;
  case 0x150:
switchD_00261551_caseD_150:
    uVar7 = puVar8[lVar12];
    pcVar9 = "spvSubgroupAllEqual";
    goto LAB_00261f3e;
  case 0x151:
switchD_00261551_caseD_151:
    uVar7 = puVar8[lVar12];
    op1 = puVar8[lVar12 + 1];
    pcVar9 = "spvSubgroupBroadcast";
    break;
  case 0x152:
switchD_00261551_caseD_152:
    uVar7 = puVar8[lVar12];
    pcVar9 = "spvSubgroupBroadcastFirst";
    goto LAB_00261f3e;
  case 0x153:
switchD_00261551_caseD_153:
    uVar7 = puVar8[lVar12];
    pcVar9 = "spvSubgroupBallot";
    goto LAB_00261f3e;
  case 0x154:
    uVar7 = puVar8[lVar12];
    op1 = this->builtin_subgroup_invocation_id_id;
    goto LAB_00261a5b;
  case 0x155:
    uVar7 = puVar8[lVar12];
    op1 = puVar8[lVar12 + 1];
LAB_00261a5b:
    pcVar9 = "spvSubgroupBallotBitExtract";
    break;
  case 0x156:
    uVar10 = iVar11 + 1;
    uVar7 = puVar8[lVar12];
    if (uVar7 == 2) {
      uVar7 = puVar8[uVar10];
      op1 = this->builtin_subgroup_invocation_id_id;
      pcVar9 = "spvSubgroupBallotExclusiveBitCount";
    }
    else if (uVar7 == 1) {
      uVar7 = puVar8[uVar10];
      op1 = this->builtin_subgroup_invocation_id_id;
      pcVar9 = "spvSubgroupBallotInclusiveBitCount";
    }
    else {
      if (uVar7 != 0) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Invalid BitCount operation.");
        goto LAB_00261ff6;
      }
      uVar7 = puVar8[uVar10];
      op1 = this->builtin_subgroup_size_id;
      pcVar9 = "spvSubgroupBallotBitCount";
    }
    break;
  case 0x157:
    uVar7 = puVar8[lVar12];
    op1 = this->builtin_subgroup_size_id;
    pcVar9 = "spvSubgroupBallotFindLSB";
    break;
  case 0x158:
    uVar7 = puVar8[lVar12];
    op1 = this->builtin_subgroup_size_id;
    pcVar9 = "spvSubgroupBallotFindMSB";
    break;
  case 0x159:
    uVar7 = puVar8[lVar12];
    op1 = puVar8[lVar12 + 1];
    pcVar9 = "spvSubgroupShuffle";
    break;
  case 0x15a:
    uVar7 = puVar8[lVar12];
    op1 = puVar8[lVar12 + 1];
    pcVar9 = "spvSubgroupShuffleXor";
    break;
  case 0x15b:
    uVar7 = puVar8[lVar12];
    op1 = puVar8[lVar12 + 1];
    pcVar9 = "spvSubgroupShuffleUp";
    break;
  case 0x15c:
    uVar7 = puVar8[lVar12];
    op1 = puVar8[lVar12 + 1];
    pcVar9 = "spvSubgroupShuffleDown";
    break;
  case 0x15d:
    switch(puVar8[lVar12]) {
    case 0:
switchD_00261932_caseD_0:
      uVar7 = puVar8[iVar11 + 1];
      pcVar9 = "simd_sum";
      break;
    case 1:
switchD_00261932_caseD_1:
      uVar7 = puVar8[iVar11 + 1];
      pcVar9 = "simd_prefix_inclusive_sum";
      break;
    case 2:
switchD_00261932_caseD_2:
      uVar7 = puVar8[iVar11 + 1];
      pcVar9 = "simd_prefix_exclusive_sum";
      break;
    case 3:
      uVar7 = Compiler::evaluate_constant_u32((Compiler *)this,puVar8[lVar12 + 2]);
      if (uVar7 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        goto LAB_00261ff6;
      }
LAB_00261f03:
      uVar7 = puVar8[iVar11 + 1];
      pcVar9 = "quad_sum";
      break;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_00261ff6;
    }
    goto LAB_00261f3e;
  case 0x15e:
    switch(puVar8[lVar12]) {
    case 0:
      goto switchD_00261932_caseD_0;
    case 1:
      goto switchD_00261932_caseD_1;
    case 2:
      goto switchD_00261932_caseD_2;
    case 3:
      uVar7 = Compiler::evaluate_constant_u32((Compiler *)this,puVar8[lVar12 + 2]);
      if (uVar7 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        goto LAB_00261ff6;
      }
      goto LAB_00261f03;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_00261ff6;
    }
  case 0x15f:
    switch(puVar8[lVar12]) {
    case 0:
switchD_00261b0f_caseD_0:
      uVar7 = puVar8[iVar11 + 1];
      pcVar9 = "simd_product";
      break;
    case 1:
switchD_00261b0f_caseD_1:
      uVar7 = puVar8[iVar11 + 1];
      pcVar9 = "simd_prefix_inclusive_product";
      break;
    case 2:
switchD_00261b0f_caseD_2:
      uVar7 = puVar8[iVar11 + 1];
      pcVar9 = "simd_prefix_exclusive_product";
      break;
    case 3:
      uVar7 = Compiler::evaluate_constant_u32((Compiler *)this,puVar8[lVar12 + 2]);
      if (uVar7 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        goto LAB_00261ff6;
      }
LAB_00261f2b:
      uVar7 = puVar8[iVar11 + 1];
      pcVar9 = "quad_product";
      break;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_00261ff6;
    }
    goto LAB_00261f3e;
  case 0x160:
    switch(puVar8[lVar12]) {
    case 0:
      goto switchD_00261b0f_caseD_0;
    case 1:
      goto switchD_00261b0f_caseD_1;
    case 2:
      goto switchD_00261b0f_caseD_2;
    case 3:
      uVar7 = Compiler::evaluate_constant_u32((Compiler *)this,puVar8[lVar12 + 2]);
      if (uVar7 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        goto LAB_00261ff6;
      }
      goto LAB_00261f2b;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_00261ff6;
    }
  case 0x161:
    if (3 < puVar8[lVar12]) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_00261ff6;
    }
    switch(puVar8[lVar12]) {
    case 0:
      uVar7 = puVar8[iVar11 + 1U];
      pcVar9 = "simd_min";
      break;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformSMin.");
      goto LAB_00261ff6;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformSMin.");
LAB_00261ff6:
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    case 3:
      uVar7 = Compiler::evaluate_constant_u32((Compiler *)this,puVar8[lVar12 + 2]);
      if (uVar7 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        goto LAB_00261ff6;
      }
      uVar7 = puVar8[iVar11 + 1U];
      pcVar9 = "quad_min";
    }
LAB_00261e22:
    CompilerGLSL::emit_unary_func_op_cast
              (&this->super_CompilerGLSL,uVar5,uVar2,uVar7,pcVar9,input_type,input_type);
    goto LAB_00261f49;
  case 0x162:
    if (3 < puVar8[lVar12]) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_00261ff6;
    }
    switch(puVar8[lVar12]) {
    case 0:
      uVar7 = puVar8[iVar11 + 1U];
      pcVar9 = "simd_min";
      input_type = BVar3;
      break;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformUMin.");
      goto LAB_00261ff6;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformUMin.");
      goto LAB_00261ff6;
    case 3:
      uVar7 = Compiler::evaluate_constant_u32((Compiler *)this,puVar8[lVar12 + 2]);
      if (uVar7 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        goto LAB_00261ff6;
      }
      uVar7 = puVar8[iVar11 + 1U];
      pcVar9 = "quad_min";
      input_type = BVar3;
    }
    goto LAB_00261e22;
  case 0x163:
    if (3 < puVar8[lVar12]) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_00261ff6;
    }
    switch(puVar8[lVar12]) {
    case 0:
      uVar7 = puVar8[iVar11 + 1U];
      pcVar9 = "simd_min";
      break;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformFMin.");
      goto LAB_00261ff6;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformFMin.");
      goto LAB_00261ff6;
    case 3:
      uVar7 = Compiler::evaluate_constant_u32((Compiler *)this,puVar8[lVar12 + 2]);
      if (uVar7 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        goto LAB_00261ff6;
      }
      uVar7 = puVar8[iVar11 + 1U];
      pcVar9 = "quad_min";
    }
    goto LAB_00261f3e;
  case 0x164:
    if (3 < puVar8[lVar12]) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_00261ff6;
    }
    switch(puVar8[lVar12]) {
    case 0:
      uVar7 = puVar8[iVar11 + 1U];
      pcVar9 = "simd_max";
      break;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformSMax.");
      goto LAB_00261ff6;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformSMax.");
      goto LAB_00261ff6;
    case 3:
      uVar7 = Compiler::evaluate_constant_u32((Compiler *)this,puVar8[lVar12 + 2]);
      if (uVar7 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        goto LAB_00261ff6;
      }
      uVar7 = puVar8[iVar11 + 1U];
      pcVar9 = "quad_max";
    }
    goto LAB_00261e22;
  case 0x165:
    if (3 < puVar8[lVar12]) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_00261ff6;
    }
    switch(puVar8[lVar12]) {
    case 0:
      uVar7 = puVar8[iVar11 + 1U];
      pcVar9 = "simd_max";
      input_type = BVar3;
      break;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformUMax.");
      goto LAB_00261ff6;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformUMax.");
      goto LAB_00261ff6;
    case 3:
      uVar7 = Compiler::evaluate_constant_u32((Compiler *)this,puVar8[lVar12 + 2]);
      if (uVar7 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        goto LAB_00261ff6;
      }
      uVar7 = puVar8[iVar11 + 1U];
      pcVar9 = "quad_max";
      input_type = BVar3;
    }
    goto LAB_00261e22;
  case 0x166:
    if (3 < puVar8[lVar12]) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
      goto LAB_00261ff6;
    }
    switch(puVar8[lVar12]) {
    case 0:
      uVar7 = puVar8[iVar11 + 1U];
      pcVar9 = "simd_max";
      break;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformFMax.");
      goto LAB_00261ff6;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformFMax.");
      goto LAB_00261ff6;
    case 3:
      uVar7 = Compiler::evaluate_constant_u32((Compiler *)this,puVar8[lVar12 + 2]);
      if (uVar7 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        goto LAB_00261ff6;
      }
      uVar7 = puVar8[iVar11 + 1U];
      pcVar9 = "quad_max";
    }
    goto LAB_00261f3e;
  case 0x167:
    switch(puVar8[lVar12]) {
    case 0:
switchD_00261bbb_caseD_0:
      uVar7 = puVar8[iVar11 + 1];
      pcVar9 = "simd_and";
      goto LAB_00261f3e;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformBitwiseAnd.");
      break;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformBitwiseAnd.");
      break;
    case 3:
      uVar7 = Compiler::evaluate_constant_u32((Compiler *)this,puVar8[lVar12 + 2]);
      if (uVar7 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        break;
      }
LAB_00261e6f:
      uVar7 = puVar8[iVar11 + 1];
      pcVar9 = "quad_and";
      goto LAB_00261f3e;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
    }
    goto LAB_00261ff6;
  case 0x168:
    switch(puVar8[lVar12]) {
    case 0:
switchD_00261a89_caseD_0:
      uVar7 = puVar8[iVar11 + 1];
      pcVar9 = "simd_or";
      goto LAB_00261f3e;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformBitwiseOr.");
      break;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformBitwiseOr.");
      break;
    case 3:
      uVar7 = Compiler::evaluate_constant_u32((Compiler *)this,puVar8[lVar12 + 2]);
      if (uVar7 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        break;
      }
LAB_00261da9:
      uVar7 = puVar8[iVar11 + 1];
      pcVar9 = "quad_or";
      goto LAB_00261f3e;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
    }
    goto LAB_00261ff6;
  case 0x169:
    switch(puVar8[lVar12]) {
    case 0:
switchD_002618d5_caseD_0:
      uVar7 = puVar8[iVar11 + 1];
      pcVar9 = "simd_xor";
      goto LAB_00261f3e;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformBitwiseXor.");
      break;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformBitwiseXor.");
      break;
    case 3:
      uVar7 = Compiler::evaluate_constant_u32((Compiler *)this,puVar8[lVar12 + 2]);
      if (uVar7 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        break;
      }
LAB_00261e44:
      uVar7 = puVar8[iVar11 + 1];
      pcVar9 = "quad_xor";
      goto LAB_00261f3e;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
    }
    goto LAB_00261ff6;
  case 0x16a:
    switch(puVar8[lVar12]) {
    case 0:
      goto switchD_00261bbb_caseD_0;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformLogicalAnd.");
      break;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformLogicalAnd.");
      break;
    case 3:
      uVar7 = Compiler::evaluate_constant_u32((Compiler *)this,puVar8[lVar12 + 2]);
      if (uVar7 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        break;
      }
      goto LAB_00261e6f;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
    }
    goto LAB_00261ff6;
  case 0x16b:
    switch(puVar8[lVar12]) {
    case 0:
      goto switchD_00261a89_caseD_0;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformLogicalOr.");
      break;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformLogicalOr.");
      break;
    case 3:
      uVar7 = Compiler::evaluate_constant_u32((Compiler *)this,puVar8[lVar12 + 2]);
      if (uVar7 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        break;
      }
      goto LAB_00261da9;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
    }
    goto LAB_00261ff6;
  case 0x16c:
    switch(puVar8[lVar12]) {
    case 0:
      goto switchD_002618d5_caseD_0;
    case 1:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformLogicalXor.");
      break;
    case 2:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformLogicalXor.");
      break;
    case 3:
      uVar7 = Compiler::evaluate_constant_u32((Compiler *)this,puVar8[lVar12 + 2]);
      if (uVar7 != 4) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Metal only supports quad ClusteredReduce.");
        break;
      }
      goto LAB_00261e44;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid group operation.");
    }
    goto LAB_00261ff6;
  case 0x16d:
    uVar7 = puVar8[lVar12];
    op1 = puVar8[lVar12 + 1];
    pcVar9 = "spvQuadBroadcast";
    break;
  case 0x16e:
    uVar7 = puVar8[lVar12];
    op1 = puVar8[lVar12 + 1];
    pcVar9 = "spvQuadSwap";
    break;
  default:
    switch(uVar10) {
    case 0:
      goto switchD_00261551_caseD_153;
    case 1:
      goto switchD_00261551_caseD_152;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Invalid opcode for subgroup.");
      goto LAB_00261ff6;
    case 7:
      goto switchD_00261551_caseD_14e;
    case 8:
      goto switchD_00261551_caseD_14f;
    case 9:
      goto switchD_00261551_caseD_150;
    case 0xb:
      goto switchD_00261551_caseD_151;
    }
  }
  CompilerGLSL::emit_binary_func_op(&this->super_CompilerGLSL,uVar5,uVar2,uVar7,op1,pcVar9);
LAB_00261f49:
  CompilerGLSL::register_control_dependent_expression(&this->super_CompilerGLSL,uVar2);
  return;
switchD_00261551_caseD_14e:
  uVar7 = puVar8[lVar12];
  if (((this->msl_options).platform == iOS) &&
     (((this->msl_options).ios_use_simdgroup_functions & 1U) == 0)) {
    pcVar9 = "quad_all";
  }
  else {
    pcVar9 = "simd_all";
  }
LAB_00261f3e:
  CompilerGLSL::emit_unary_func_op(&this->super_CompilerGLSL,uVar5,uVar2,uVar7,pcVar9);
  goto LAB_00261f49;
}

Assistant:

void CompilerMSL::emit_subgroup_op(const Instruction &i)
{
	const uint32_t *ops = stream(i);
	auto op = static_cast<Op>(i.op);

	if (msl_options.emulate_subgroups)
	{
		// In this mode, only the GroupNonUniform cap is supported. The only op
		// we need to handle, then, is OpGroupNonUniformElect.
		if (op != OpGroupNonUniformElect)
			SPIRV_CROSS_THROW("Subgroup emulation does not support operations other than Elect.");
		// In this mode, the subgroup size is assumed to be one, so every invocation
		// is elected.
		emit_op(ops[0], ops[1], "true", true);
		return;
	}

	// Metal 2.0 is required. iOS only supports quad ops on 11.0 (2.0), with
	// full support in 13.0 (2.2). macOS only supports broadcast and shuffle on
	// 10.13 (2.0), with full support in 10.14 (2.1).
	// Note that Apple GPUs before A13 make no distinction between a quad-group
	// and a SIMD-group; all SIMD-groups are quad-groups on those.
	if (!msl_options.supports_msl_version(2))
		SPIRV_CROSS_THROW("Subgroups are only supported in Metal 2.0 and up.");

	// If we need to do implicit bitcasts, make sure we do it with the correct type.
	uint32_t integer_width = get_integer_width_for_instruction(i);
	auto int_type = to_signed_basetype(integer_width);
	auto uint_type = to_unsigned_basetype(integer_width);

	if (msl_options.is_ios() && (!msl_options.supports_msl_version(2, 3) || !msl_options.ios_use_simdgroup_functions))
	{
		switch (op)
		{
		default:
			SPIRV_CROSS_THROW("Subgroup ops beyond broadcast, ballot, and shuffle on iOS require Metal 2.3 and up.");
		case OpGroupNonUniformBroadcastFirst:
			if (!msl_options.supports_msl_version(2, 2))
				SPIRV_CROSS_THROW("BroadcastFirst on iOS requires Metal 2.2 and up.");
			break;
		case OpGroupNonUniformElect:
			if (!msl_options.supports_msl_version(2, 2))
				SPIRV_CROSS_THROW("Elect on iOS requires Metal 2.2 and up.");
			break;
		case OpGroupNonUniformAny:
		case OpGroupNonUniformAll:
		case OpGroupNonUniformAllEqual:
		case OpGroupNonUniformBallot:
		case OpGroupNonUniformInverseBallot:
		case OpGroupNonUniformBallotBitExtract:
		case OpGroupNonUniformBallotFindLSB:
		case OpGroupNonUniformBallotFindMSB:
		case OpGroupNonUniformBallotBitCount:
		case OpSubgroupBallotKHR:
		case OpSubgroupAllKHR:
		case OpSubgroupAnyKHR:
		case OpSubgroupAllEqualKHR:
			if (!msl_options.supports_msl_version(2, 2))
				SPIRV_CROSS_THROW("Ballot ops on iOS requires Metal 2.2 and up.");
			break;
		case OpGroupNonUniformBroadcast:
		case OpGroupNonUniformShuffle:
		case OpGroupNonUniformShuffleXor:
		case OpGroupNonUniformShuffleUp:
		case OpGroupNonUniformShuffleDown:
		case OpGroupNonUniformQuadSwap:
		case OpGroupNonUniformQuadBroadcast:
		case OpSubgroupReadInvocationKHR:
			break;
		}
	}

	if (msl_options.is_macos() && !msl_options.supports_msl_version(2, 1))
	{
		switch (op)
		{
		default:
			SPIRV_CROSS_THROW("Subgroup ops beyond broadcast and shuffle on macOS require Metal 2.1 and up.");
		case OpGroupNonUniformBroadcast:
		case OpGroupNonUniformShuffle:
		case OpGroupNonUniformShuffleXor:
		case OpGroupNonUniformShuffleUp:
		case OpGroupNonUniformShuffleDown:
		case OpSubgroupReadInvocationKHR:
			break;
		}
	}

	uint32_t op_idx = 0;
	uint32_t result_type = ops[op_idx++];
	uint32_t id = ops[op_idx++];

	Scope scope;
	switch (op)
	{
	case OpSubgroupBallotKHR:
	case OpSubgroupFirstInvocationKHR:
	case OpSubgroupReadInvocationKHR:
	case OpSubgroupAllKHR:
	case OpSubgroupAnyKHR:
	case OpSubgroupAllEqualKHR:
		// These earlier instructions don't have the scope operand.
		scope = ScopeSubgroup;
		break;
	default:
		scope = static_cast<Scope>(evaluate_constant_u32(ops[op_idx++]));
		break;
	}
	if (scope != ScopeSubgroup)
		SPIRV_CROSS_THROW("Only subgroup scope is supported.");

	switch (op)
	{
	case OpGroupNonUniformElect:
		if (msl_options.use_quadgroup_operation())
			emit_op(result_type, id, "quad_is_first()", false);
		else
			emit_op(result_type, id, "simd_is_first()", false);
		break;

	case OpGroupNonUniformBroadcast:
	case OpSubgroupReadInvocationKHR:
		emit_binary_func_op(result_type, id, ops[op_idx], ops[op_idx + 1], "spvSubgroupBroadcast");
		break;

	case OpGroupNonUniformBroadcastFirst:
	case OpSubgroupFirstInvocationKHR:
		emit_unary_func_op(result_type, id, ops[op_idx], "spvSubgroupBroadcastFirst");
		break;

	case OpGroupNonUniformBallot:
	case OpSubgroupBallotKHR:
		emit_unary_func_op(result_type, id, ops[op_idx], "spvSubgroupBallot");
		break;

	case OpGroupNonUniformInverseBallot:
		emit_binary_func_op(result_type, id, ops[op_idx], builtin_subgroup_invocation_id_id, "spvSubgroupBallotBitExtract");
		break;

	case OpGroupNonUniformBallotBitExtract:
		emit_binary_func_op(result_type, id, ops[op_idx], ops[op_idx + 1], "spvSubgroupBallotBitExtract");
		break;

	case OpGroupNonUniformBallotFindLSB:
		emit_binary_func_op(result_type, id, ops[op_idx], builtin_subgroup_size_id, "spvSubgroupBallotFindLSB");
		break;

	case OpGroupNonUniformBallotFindMSB:
		emit_binary_func_op(result_type, id, ops[op_idx], builtin_subgroup_size_id, "spvSubgroupBallotFindMSB");
		break;

	case OpGroupNonUniformBallotBitCount:
	{
		auto operation = static_cast<GroupOperation>(ops[op_idx++]);
		switch (operation)
		{
		case GroupOperationReduce:
			emit_binary_func_op(result_type, id, ops[op_idx], builtin_subgroup_size_id, "spvSubgroupBallotBitCount");
			break;
		case GroupOperationInclusiveScan:
			emit_binary_func_op(result_type, id, ops[op_idx], builtin_subgroup_invocation_id_id,
			                    "spvSubgroupBallotInclusiveBitCount");
			break;
		case GroupOperationExclusiveScan:
			emit_binary_func_op(result_type, id, ops[op_idx], builtin_subgroup_invocation_id_id,
			                    "spvSubgroupBallotExclusiveBitCount");
			break;
		default:
			SPIRV_CROSS_THROW("Invalid BitCount operation.");
		}
		break;
	}

	case OpGroupNonUniformShuffle:
		emit_binary_func_op(result_type, id, ops[op_idx], ops[op_idx + 1], "spvSubgroupShuffle");
		break;

	case OpGroupNonUniformShuffleXor:
		emit_binary_func_op(result_type, id, ops[op_idx], ops[op_idx + 1], "spvSubgroupShuffleXor");
		break;

	case OpGroupNonUniformShuffleUp:
		emit_binary_func_op(result_type, id, ops[op_idx], ops[op_idx + 1], "spvSubgroupShuffleUp");
		break;

	case OpGroupNonUniformShuffleDown:
		emit_binary_func_op(result_type, id, ops[op_idx], ops[op_idx + 1], "spvSubgroupShuffleDown");
		break;

	case OpGroupNonUniformAll:
	case OpSubgroupAllKHR:
		if (msl_options.use_quadgroup_operation())
			emit_unary_func_op(result_type, id, ops[op_idx], "quad_all");
		else
			emit_unary_func_op(result_type, id, ops[op_idx], "simd_all");
		break;

	case OpGroupNonUniformAny:
	case OpSubgroupAnyKHR:
		if (msl_options.use_quadgroup_operation())
			emit_unary_func_op(result_type, id, ops[op_idx], "quad_any");
		else
			emit_unary_func_op(result_type, id, ops[op_idx], "simd_any");
		break;

	case OpGroupNonUniformAllEqual:
	case OpSubgroupAllEqualKHR:
		emit_unary_func_op(result_type, id, ops[op_idx], "spvSubgroupAllEqual");
		break;

		// clang-format off
#define MSL_GROUP_OP(op, msl_op) \
case OpGroupNonUniform##op: \
	{ \
		auto operation = static_cast<GroupOperation>(ops[op_idx++]); \
		if (operation == GroupOperationReduce) \
			emit_unary_func_op(result_type, id, ops[op_idx], "simd_" #msl_op); \
		else if (operation == GroupOperationInclusiveScan) \
			emit_unary_func_op(result_type, id, ops[op_idx], "simd_prefix_inclusive_" #msl_op); \
		else if (operation == GroupOperationExclusiveScan) \
			emit_unary_func_op(result_type, id, ops[op_idx], "simd_prefix_exclusive_" #msl_op); \
		else if (operation == GroupOperationClusteredReduce) \
		{ \
			/* Only cluster sizes of 4 are supported. */ \
			uint32_t cluster_size = evaluate_constant_u32(ops[op_idx + 1]); \
			if (cluster_size != 4) \
				SPIRV_CROSS_THROW("Metal only supports quad ClusteredReduce."); \
			emit_unary_func_op(result_type, id, ops[op_idx], "quad_" #msl_op); \
		} \
		else \
			SPIRV_CROSS_THROW("Invalid group operation."); \
		break; \
	}